

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_search.cpp
# Opt level: O3

void __thiscall
ANNkd_tree::annkSearch
          (ANNkd_tree *this,ANNpoint q,int k,ANNidxArray nn_idx,ANNdistArray dd,double eps)

{
  double *pdVar1;
  int *piVar2;
  ANNkd_ptr pAVar3;
  double *pdVar4;
  int *piVar5;
  ANNmin_k *pAVar6;
  mk_node *pmVar7;
  long lVar8;
  ANNidx AVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ANNdist AVar13;
  
  ANNkdDim = this->dim;
  lVar12 = (long)ANNkdDim;
  uVar10 = lVar12 * 8;
  if (lVar12 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  uVar11 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar10);
  ANNScale = pdVar4;
  piVar5 = (int *)operator_new__(uVar11);
  ANNTopology = piVar5;
  if (0 < lVar12) {
    pdVar1 = this->Scale;
    piVar2 = this->Topology;
    lVar8 = 0;
    do {
      pdVar4[lVar8] = pdVar1[lVar8];
      piVar5[lVar8] = piVar2[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar12 != lVar8);
  }
  ANNkdPts = this->pts;
  ANNptsVisited = 0;
  ANNkdQ = q;
  if (this->n_pts < k) {
    annError("Requesting more near neighbors than data points",ANNabort);
  }
  ANNkdMaxErr = (eps + 1.0) * (eps + 1.0);
  pAVar6 = (ANNmin_k *)operator_new(0x10);
  pAVar6->n = 0;
  pAVar6->k = k;
  uVar10 = 0xffffffffffffffff;
  if (-2 < k) {
    uVar10 = (ulong)(k + 1) << 4;
  }
  pmVar7 = (mk_node *)operator_new__(uVar10);
  pAVar6->mk = pmVar7;
  pAVar3 = this->root;
  ANNkdPointMK = pAVar6;
  annBoxDistance(q,this->bnd_box_lo,this->bnd_box_hi,this->dim,ANNScale,ANNTopology);
  (*pAVar3->_vptr_ANNkd_node[2])(pAVar3);
  pAVar6 = ANNkdPointMK;
  if (0 < k) {
    lVar12 = 1;
    uVar10 = 0;
    do {
      AVar9 = -1;
      AVar13 = 1.79769313486232e+308;
      if ((long)uVar10 < (long)pAVar6->n) {
        pmVar7 = pAVar6->mk;
        AVar13 = *(ANNdist *)((long)pmVar7 + lVar12 * 8 + -8);
        AVar9 = *(ANNidx *)(&pmVar7->key + lVar12);
      }
      dd[uVar10] = AVar13;
      nn_idx[uVar10] = AVar9;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 2;
    } while ((uint)k != uVar10);
  }
  if (ANNScale != (double *)0x0) {
    operator_delete__(ANNScale);
  }
  if (ANNTopology != (int *)0x0) {
    operator_delete__(ANNTopology);
  }
  pAVar6 = ANNkdPointMK;
  if ((ANNkdPointMK != (ANNmin_k *)0x0) && (ANNkdPointMK->mk != (mk_node *)0x0)) {
    operator_delete__(ANNkdPointMK->mk);
  }
  operator_delete(pAVar6);
  return;
}

Assistant:

void ANNkd_tree::annkSearch(
    ANNpoint q,          // the query point
    int k,               // number of near neighbors to return
    ANNidxArray nn_idx,  // nearest neighbor indices (returned)
    ANNdistArray dd,     // the approximate nearest neighbor
    double eps)          // the error bound
{
    ANNkdDim = dim;  // copy arguments to static equivs
    ANNScale = new double[dim];
    ANNTopology = new int[dim];
    for (int i = 0; i < dim; i++) {
        ANNScale[i] = Scale[i];
        ANNTopology[i] = Topology[i];
    }
    ANNkdQ = q;
    ANNkdPts = pts;
    ANNptsVisited = 0;  // initialize count of points visited

    if (k > n_pts) {  // too many near neighbors?
        annError("Requesting more near neighbors than data points", ANNabort);
    }

    ANNkdMaxErr = ANN_POW(1.0 + eps);
    //    FLOP(2)				// increment floating op count

    ANNkdPointMK = new ANNmin_k(k);  // create set for closest k points
                                     // search starting at the root
    root->ann_search(
        annBoxDistance(q, bnd_box_lo, bnd_box_hi, dim, ANNScale, ANNTopology));

    for (int i = 0; i < k; i++) {  // extract the k-th closest points
        dd[i] = ANNkdPointMK->ith_smallest_key(i);
        nn_idx[i] = ANNkdPointMK->ith_smallest_info(i);
    }
    delete[] ANNScale;
    delete[] ANNTopology;
    delete ANNkdPointMK;  // deallocate closest point set
}